

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O1

void __thiscall QPDF::dumpHPageOffset(QPDF *this)

{
  int i;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var1;
  _Head_base<0UL,_QPDF::Members_*,_false> _Var2;
  Members *pMVar3;
  Pipeline *pPVar4;
  ulong uVar5;
  long lVar6;
  int *piVar7;
  QPDFLogger local_50;
  ulong local_40;
  Members *local_38;
  
  _Var1._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  QPDFLogger::getInfo(&local_50,SUB81(*(undefined8 *)&(_Var1._M_head_impl)->log,0));
  pPVar4 = Pipeline::operator<<
                     ((Pipeline *)
                      local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,"min_nobjects: ");
  pPVar4 = Pipeline::operator<<(pPVar4,((_Var1._M_head_impl)->page_offset_hints).min_nobjects);
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"first_page_offset: ");
  lVar6 = *(qpdf_offset_t *)((long)&(_Var1._M_head_impl)->page_offset_hints + 8);
  _Var2._M_head_impl =
       (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t
       .super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
       super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
  if (*(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x30) <= lVar6) {
    lVar6 = lVar6 + *(qpdf_offset_t *)((long)&(_Var2._M_head_impl)->linp + 0x38);
  }
  pPVar4 = Pipeline::operator<<(pPVar4,lVar6);
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_nobjects: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x10));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_page_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x14));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_page_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x18));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_content_offset: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x1c));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_content_offset: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x20));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"min_content_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x24));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_delta_content_length: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x28));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_nshared_objects: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x2c));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_shared_identifier: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x30));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"nbits_shared_numerator: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x34));
  pPVar4 = Pipeline::operator<<(pPVar4,"\n");
  pPVar4 = Pipeline::operator<<(pPVar4,"shared_denominator: ");
  pPVar4 = Pipeline::operator<<
                     (pPVar4,*(int *)((long)&(_Var1._M_head_impl)->page_offset_hints + 0x38));
  Pipeline::operator<<(pPVar4,"\n");
  if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  local_40 = 0;
  local_38 = _Var1._M_head_impl;
  do {
    pMVar3 = local_38;
    _Var1._M_head_impl =
         (this->m)._M_t.super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>.
         _M_t.super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
         super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl;
    i = *(int *)((long)&(_Var1._M_head_impl)->linp + 0x18);
    if (i < 0) {
      QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(i);
    }
    if ((ulong)(long)*(int *)((long)&(_Var1._M_head_impl)->linp + 0x18) <= local_40) {
      return;
    }
    lVar6 = *(long *)&(pMVar3->page_offset_hints).entries.
                      super__Vector_base<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>
                      ._M_impl;
    uVar5 = ((long)*(pointer *)((long)&(pMVar3->page_offset_hints).entries + 8) - lVar6 >> 3) *
            0x2e8ba2e8ba2e8ba3;
    if (uVar5 < local_40 || uVar5 - local_40 == 0) {
      std::__throw_out_of_range_fmt
                ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                 local_40);
    }
    QPDFLogger::getInfo(&local_50,
                        SUB81(*(undefined8 *)
                               &((this->m)._M_t.
                                 super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                 .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log,0
                             ));
    pPVar4 = Pipeline::operator<<
                       ((Pipeline *)
                        local_50.m.
                        super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                        "Page ");
    pPVar4 = Pipeline::operator<<(pPVar4,local_40);
    pPVar4 = Pipeline::operator<<(pPVar4,":\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  nobjects: ");
    piVar7 = (int *)(lVar6 + local_40 * 0x58);
    pPVar4 = Pipeline::operator<<(pPVar4,(pMVar3->page_offset_hints).min_nobjects + *piVar7);
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  length: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_page_length +
                               *(long *)(piVar7 + 2));
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  content_offset: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_content_offset +
                               *(long *)(piVar7 + 0x12));
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  content_length: ");
    pPVar4 = Pipeline::operator<<
                       (pPVar4,(long)(pMVar3->page_offset_hints).min_content_length +
                               *(long *)(piVar7 + 0x14));
    pPVar4 = Pipeline::operator<<(pPVar4,"\n");
    pPVar4 = Pipeline::operator<<(pPVar4,"  nshared_objects: ");
    pPVar4 = Pipeline::operator<<(pPVar4,piVar7[4]);
    Pipeline::operator<<(pPVar4,"\n");
    if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    uVar5 = 0;
    while( true ) {
      if (piVar7[4] < 0) {
        QIntC::IntConverter<int,_unsigned_long,_true,_false>::error(piVar7[4]);
      }
      if ((ulong)(long)piVar7[4] <= uVar5) break;
      QPDFLogger::getInfo(&local_50,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_50.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"    identifier ");
      pPVar4 = Pipeline::operator<<(pPVar4,uVar5);
      pPVar4 = Pipeline::operator<<(pPVar4,": ");
      if ((ulong)(*(long *)(piVar7 + 8) - *(long *)(piVar7 + 6) >> 2) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      pPVar4 = Pipeline::operator<<(pPVar4,*(int *)(*(long *)(piVar7 + 6) + uVar5 * 4));
      Pipeline::operator<<(pPVar4,"\n");
      if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      QPDFLogger::getInfo(&local_50,
                          SUB81(*(undefined8 *)
                                 &((this->m)._M_t.
                                   super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                                   .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->log
                                ,0));
      pPVar4 = Pipeline::operator<<
                         ((Pipeline *)
                          local_50.m.
                          super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                          ,"    numerator ");
      pPVar4 = Pipeline::operator<<(pPVar4,uVar5);
      pPVar4 = Pipeline::operator<<(pPVar4,": ");
      if ((ulong)(*(long *)(piVar7 + 0xe) - *(long *)(piVar7 + 0xc) >> 2) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      pPVar4 = Pipeline::operator<<(pPVar4,*(int *)(*(long *)(piVar7 + 0xc) + uVar5 * 4));
      Pipeline::operator<<(pPVar4,"\n");
      if (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_50.m.super___shared_ptr<QPDFLogger::Members,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar5 = uVar5 + 1;
    }
    local_40 = local_40 + 1;
  } while( true );
}

Assistant:

void
QPDF::dumpHPageOffset()
{
    HPageOffset& t = m->page_offset_hints;
    *m->log->getInfo() << "min_nobjects: " << t.min_nobjects << "\n"
                       << "first_page_offset: " << adjusted_offset(t.first_page_offset) << "\n"
                       << "nbits_delta_nobjects: " << t.nbits_delta_nobjects << "\n"
                       << "min_page_length: " << t.min_page_length << "\n"
                       << "nbits_delta_page_length: " << t.nbits_delta_page_length << "\n"
                       << "min_content_offset: " << t.min_content_offset << "\n"
                       << "nbits_delta_content_offset: " << t.nbits_delta_content_offset << "\n"
                       << "min_content_length: " << t.min_content_length << "\n"
                       << "nbits_delta_content_length: " << t.nbits_delta_content_length << "\n"
                       << "nbits_nshared_objects: " << t.nbits_nshared_objects << "\n"
                       << "nbits_shared_identifier: " << t.nbits_shared_identifier << "\n"
                       << "nbits_shared_numerator: " << t.nbits_shared_numerator << "\n"
                       << "shared_denominator: " << t.shared_denominator << "\n";

    for (size_t i1 = 0; i1 < toS(m->linp.npages); ++i1) {
        HPageOffsetEntry& pe = t.entries.at(i1);
        *m->log->getInfo() << "Page " << i1 << ":\n"
                           << "  nobjects: " << pe.delta_nobjects + t.min_nobjects << "\n"
                           << "  length: " << pe.delta_page_length + t.min_page_length
                           << "\n"
                           // content offset is relative to page, not file
                           << "  content_offset: " << pe.delta_content_offset + t.min_content_offset
                           << "\n"
                           << "  content_length: " << pe.delta_content_length + t.min_content_length
                           << "\n"
                           << "  nshared_objects: " << pe.nshared_objects << "\n";
        for (size_t i2 = 0; i2 < toS(pe.nshared_objects); ++i2) {
            *m->log->getInfo() << "    identifier " << i2 << ": " << pe.shared_identifiers.at(i2)
                               << "\n";
            *m->log->getInfo() << "    numerator " << i2 << ": " << pe.shared_numerators.at(i2)
                               << "\n";
        }
    }
}